

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void __thiscall ftxui::Screen::Clear(Screen *this)

{
  int iVar1;
  int iVar2;
  allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_> local_85 [20];
  allocator<ftxui::Pixel> local_71;
  Pixel local_70;
  vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_> local_40;
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  local_28;
  Screen *local_10;
  Screen *this_local;
  
  iVar1 = this->dimy_;
  iVar2 = this->dimx_;
  local_10 = this;
  Pixel::Pixel(&local_70);
  std::allocator<ftxui::Pixel>::allocator(&local_71);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::vector
            (&local_40,(long)iVar2,&local_70,&local_71);
  std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::allocator(local_85);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::vector(&local_28,(long)iVar1,&local_40,local_85);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::operator=(&this->pixels_,&local_28);
  std::
  vector<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>,_std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>_>
  ::~vector(&local_28);
  std::allocator<std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>_>::~allocator(local_85);
  std::vector<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>::~vector(&local_40);
  std::allocator<ftxui::Pixel>::~allocator(&local_71);
  Pixel::~Pixel(&local_70);
  (this->cursor_).x = this->dimx_ + -1;
  (this->cursor_).y = this->dimy_ + -1;
  return;
}

Assistant:

void Screen::Clear() {
  pixels_ = std::vector<std::vector<Pixel>>(dimy_,
                                            std::vector<Pixel>(dimx_, Pixel()));
  cursor_.x = dimx_ - 1;
  cursor_.y = dimy_ - 1;
}